

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_for_each.cpp
# Opt level: O0

container *
anon_unknown.dwarf_87b07::ParallelForEach::run_for_each
          (container *__return_storage_ptr__,container *src)

{
  const_iterator this;
  const_iterator first;
  iterator iVar1;
  iterator iVar2;
  mutex *in_R8;
  anon_class_16_2_441e0a27 fn;
  undefined1 local_40 [8];
  mutex mut;
  container *src_local;
  container *out;
  
  mut.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)src;
  _GLOBAL__N_1::std::mutex::mutex((mutex *)local_40);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
  this = std::begin<std::vector<int,std::allocator<int>>>
                   ((vector<int,_std::allocator<int>_> *)
                    mut.super___mutex_base._M_mutex.__data.__list.__next);
  first = std::end<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)
                     mut.super___mutex_base._M_mutex.__data.__list.__next);
  fn.mut = in_R8;
  fn.out = (container *)local_40;
  pstore::
  parallel_for_each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::ParallelForEach::run_for_each(std::vector<int,std::allocator<int>>const&)::__0>
            ((pstore *)this._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __return_storage_ptr__,fn);
  iVar1 = std::begin<std::vector<int,std::allocator<int>>>(__return_storage_ptr__);
  iVar2 = std::end<std::vector<int,std::allocator<int>>>(__return_storage_ptr__);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (iVar1._M_current,iVar2._M_current);
  return __return_storage_ptr__;
}

Assistant:

auto ParallelForEach::run_for_each (container const & src) -> container {
        std::mutex mut;
        container out;
        pstore::parallel_for_each (std::begin (src), std::end (src), [&out, &mut] (int v) {
            std::lock_guard<std::mutex> _{mut};
            out.emplace_back (v * 2);
        });
        std::sort (std::begin (out), std::end (out), std::less<int> ());
        return out;
    }